

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanCommandBuffer.hpp
# Opt level: O2

void __thiscall
VulkanUtilities::VulkanCommandBuffer::DrawIndirectCount
          (VulkanCommandBuffer *this,VkBuffer Buffer,VkDeviceSize Offset,VkBuffer CountBuffer,
          VkDeviceSize CountBufferOffset,uint32_t MaxDrawCount,uint32_t Stride)

{
  string msg;
  string local_50;
  
  if (this->m_VkCmdBuffer == (VkCommandBuffer)0x0) {
    Diligent::FormatString<char[26],char[32]>
              (&local_50,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_VkCmdBuffer != VK_NULL_HANDLE",(char (*) [32])CountBuffer);
    Diligent::DebugAssertionFailed
              (local_50._M_dataplus._M_p,"DrawIndirectCount",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0xa2);
    std::__cxx11::string::~string((string *)&local_50);
  }
  if (((this->m_State).RenderPass == (VkRenderPass)0x0) &&
     ((this->m_State).DynamicRenderingHash == 0)) {
    Diligent::FormatString<char[169]>
              (&local_50,
               (char (*) [169])
               "vkCmdDrawIndirectCountKHR() must be called inside render pass (https://registry.khronos.org/vulkan/specs/latest/html/vkspec.html#VUID-vkCmdDrawIndirectCount-renderpass)"
              );
    Diligent::DebugAssertionFailed
              (local_50._M_dataplus._M_p,"DrawIndirectCount",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0xa5);
    std::__cxx11::string::~string((string *)&local_50);
  }
  if ((this->m_State).GraphicsPipeline == (VkPipeline)0x0) {
    Diligent::FormatString<char[27]>(&local_50,(char (*) [27])"No graphics pipeline bound");
    Diligent::DebugAssertionFailed
              (local_50._M_dataplus._M_p,"DrawIndirectCount",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0xa6);
    std::__cxx11::string::~string((string *)&local_50);
  }
  (*vkCmdDrawIndirectCountKHR)
            (this->m_VkCmdBuffer,Buffer,Offset,CountBuffer,CountBufferOffset,MaxDrawCount,Stride);
  return;
}

Assistant:

__forceinline void DrawIndirectCount(VkBuffer Buffer, VkDeviceSize Offset, VkBuffer CountBuffer, VkDeviceSize CountBufferOffset, uint32_t MaxDrawCount, uint32_t Stride)
    {
#if DILIGENT_USE_VOLK
        VERIFY_EXPR(m_VkCmdBuffer != VK_NULL_HANDLE);
        VERIFY(IsInRenderScope(),
               "vkCmdDrawIndirectCountKHR() must be called inside render pass "
               "(https://registry.khronos.org/vulkan/specs/latest/html/vkspec.html#VUID-vkCmdDrawIndirectCount-renderpass)");
        VERIFY(m_State.GraphicsPipeline != VK_NULL_HANDLE, "No graphics pipeline bound");

        vkCmdDrawIndirectCountKHR(m_VkCmdBuffer, Buffer, Offset, CountBuffer, CountBufferOffset, MaxDrawCount, Stride);
#else
        UNSUPPORTED("DrawIndirectCount is not supported when vulkan library is linked statically");
#endif
    }